

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O1

void __thiscall
loguru::LogScopeRAII::LogScopeRAII
          (LogScopeRAII *this,Verbosity verbosity,char *file,uint line,char *format,...)

{
  long lVar1;
  char in_AL;
  int iVar2;
  Callback *p;
  longlong lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vlist;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  this->_verbosity = verbosity;
  this->_file = file;
  this->_line = line;
  iVar2 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar2 = g_stderr_verbosity;
  }
  if (iVar2 < verbosity) {
    this->_file = (char *)0x0;
  }
  else {
    local_c0 = in_R9;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)s_mutex);
    if (iVar2 != 0) {
      uVar5 = std::__throw_system_error(iVar2);
      pthread_mutex_unlock((pthread_mutex_t *)s_mutex);
      _Unwind_Resume(uVar5);
    }
    this->_indent_stderr = verbosity <= g_stderr_verbosity;
    lVar3 = std::chrono::_V2::system_clock::now();
    this->_start_time_ns = lVar3;
    local_f8 = local_e8;
    local_100 = &vlist[0].overflow_arg_area;
    local_108 = 0x3000000028;
    vsnprintf(this->_name,0xc4,format,&local_108);
    log_to_everywhere(1,this->_verbosity,file,line,"{ ",this->_name);
    lVar1 = DAT_0016ad40;
    lVar4 = s_callbacks;
    if (this->_indent_stderr == true) {
      LOCK();
      s_stderr_indentation = s_stderr_indentation + 1;
      UNLOCK();
    }
    for (; lVar4 != lVar1; lVar4 = lVar4 + 0x50) {
      if (verbosity <= *(int *)(lVar4 + 0x30)) {
        *(int *)(lVar4 + 0x48) = *(int *)(lVar4 + 0x48) + 1;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)s_mutex);
  }
  return;
}

Assistant:

LogScopeRAII::LogScopeRAII(Verbosity verbosity, const char* file, unsigned line, const char* format, ...)
		: _verbosity(verbosity), _file(file), _line(line)
	{
		if (verbosity <= current_verbosity_cutoff()) {
			std::lock_guard<std::recursive_mutex> lock(s_mutex);
			_indent_stderr = (verbosity <= g_stderr_verbosity);
			_start_time_ns = now_ns();
			va_list vlist;
			va_start(vlist, format);
			vsnprintf(_name, sizeof(_name), format, vlist);
			log_to_everywhere(1, _verbosity, file, line, "{ ", _name);
			va_end(vlist);

			if (_indent_stderr) {
				++s_stderr_indentation;
			}

			for (auto& p : s_callbacks) {
				if (verbosity <= p.verbosity) {
					++p.indentation;
				}
			}
		} else {
			_file = nullptr;
		}
	}